

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTexture.cpp
# Opt level: O2

void __thiscall vkt::image::Texture::checkInvariants(Texture *this)

{
  return;
}

Assistant:

void Texture::checkInvariants (void) const
{
	DE_ASSERT((m_numSamples == 1)  || (m_numSamples == 2)  || (m_numSamples == 4) || (m_numSamples == 8) ||
			  (m_numSamples == 16) || (m_numSamples == 32) || (m_numSamples == 64));
	DE_ASSERT(m_numLayers >= 1);
	DE_ASSERT(m_layerSize.x() >= 1 && m_layerSize.y() >= 1 && m_layerSize.z() >= 1);

	switch (m_type)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			DE_ASSERT(m_numLayers == 1);
			DE_ASSERT(m_numSamples == 1);
			DE_ASSERT(m_layerSize.y() == 1 && m_layerSize.z() == 1);
			break;

		case IMAGE_TYPE_1D_ARRAY:
			DE_ASSERT(m_numSamples == 1);
			DE_ASSERT(m_layerSize.y() == 1 && m_layerSize.z() == 1);
			break;

		case IMAGE_TYPE_2D:
			DE_ASSERT(m_numLayers == 1);
			DE_ASSERT(m_layerSize.z() == 1);
			break;

		case IMAGE_TYPE_2D_ARRAY:
			DE_ASSERT(m_layerSize.z() == 1);
			break;

		case IMAGE_TYPE_CUBE:
			DE_ASSERT(m_numSamples == 1);
			DE_ASSERT(m_numLayers == 6);
			DE_ASSERT(m_layerSize.z() == 1);
			break;

		case IMAGE_TYPE_CUBE_ARRAY:
			DE_ASSERT(m_numSamples == 1);
			DE_ASSERT(m_numLayers >= 6 && m_numLayers % 6 == 0);
			DE_ASSERT(m_layerSize.z() == 1);
			break;

		case IMAGE_TYPE_3D:
			DE_ASSERT(m_numSamples == 1);
			DE_ASSERT(m_numLayers == 1);
			break;

		default:
			DE_FATAL("Internal error");
			break;
	}
}